

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O2

bool __thiscall wallet::BerkeleyRODatabase::Backup(BerkeleyRODatabase *this,string *dest)

{
  string_view source_file;
  string_view source_file_00;
  bool bVar1;
  char cVar2;
  Logger *pLVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  string local_158;
  string local_138;
  path dst;
  path src;
  string log_msg;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&src.super_path,&(this->m_filepath).super_path);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&log_msg,dest,auto_format);
  std::filesystem::__cxx11::path::path(&dst.super_path,(path *)&log_msg);
  std::filesystem::__cxx11::path::~path((path *)&log_msg);
  bVar1 = std::filesystem::is_directory(&dst.super_path);
  if (bVar1) {
    BDBDataFile((path *)&log_msg,&dst);
    std::filesystem::__cxx11::path::operator=(&dst.super_path,(path *)&log_msg);
    std::filesystem::__cxx11::path::~path((path *)&log_msg);
  }
  bVar1 = std::filesystem::exists(&dst.super_path);
  if (bVar1) {
    cVar2 = std::filesystem::equivalent((path *)&src,(path *)&dst);
    if (cVar2 != '\0') {
      std::filesystem::__cxx11::path::string(&local_138,&dst.super_path);
      pLVar3 = LogInstance();
      bVar1 = BCLog::Logger::Enabled(pLVar3);
      if (bVar1) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<std::__cxx11::string>
                  (&local_40,(tinyformat *)"cannot backup to wallet source file %s\n",
                   (char *)&local_138,in_RCX);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        pLVar3 = LogInstance();
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/migrate.cpp"
        ;
        source_file._M_len = 0x5b;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "Backup";
        logging_function._M_len = 6;
        BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x2cd,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
      }
      std::__cxx11::string::~string((string *)&local_138);
      bVar1 = false;
      goto LAB_009e2de9;
    }
  }
  std::filesystem::copy_file((path *)&src,(path *)&dst,overwrite_existing);
  std::filesystem::__cxx11::path::string(&local_138,&(this->m_filepath).super_path);
  std::filesystem::__cxx11::path::string(&local_158,&dst.super_path);
  pLVar3 = LogInstance();
  bVar1 = BCLog::Logger::Enabled(pLVar3);
  if (bVar1) {
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_40,(tinyformat *)"copied %s to %s\n",(char *)&local_138,&local_158,in_R8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    pLVar3 = LogInstance();
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/migrate.cpp"
    ;
    source_file_00._M_len = 0x5b;
    str_00._M_str = log_msg._M_dataplus._M_p;
    str_00._M_len = log_msg._M_string_length;
    logging_function_00._M_str = "Backup";
    logging_function_00._M_len = 6;
    BCLog::Logger::LogPrintStr(pLVar3,str_00,logging_function_00,source_file_00,0x2d2,ALL,Info);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  bVar1 = true;
LAB_009e2de9:
  std::filesystem::__cxx11::path::~path(&dst.super_path);
  std::filesystem::__cxx11::path::~path(&src.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool BerkeleyRODatabase::Backup(const std::string& dest) const
{
    fs::path src(m_filepath);
    fs::path dst(fs::PathFromString(dest));

    if (fs::is_directory(dst)) {
        dst = BDBDataFile(dst);
    }
    try {
        if (fs::exists(dst) && fs::equivalent(src, dst)) {
            LogPrintf("cannot backup to wallet source file %s\n", fs::PathToString(dst));
            return false;
        }

        fs::copy_file(src, dst, fs::copy_options::overwrite_existing);
        LogPrintf("copied %s to %s\n", fs::PathToString(m_filepath), fs::PathToString(dst));
        return true;
    } catch (const fs::filesystem_error& e) {
        LogPrintf("error copying %s to %s - %s\n", fs::PathToString(m_filepath), fs::PathToString(dst), fsbridge::get_filesystem_error_message(e));
        return false;
    }
}